

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O3

int32_t __thiscall
icu_63::DateTimeMatcher::getDistance
          (DateTimeMatcher *this,DateTimeMatcher *other,int32_t includeMask,
          DistanceInfo *distanceInfo)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  
  distanceInfo->missingFieldMask = 0;
  distanceInfo->extraFieldMask = 0;
  lVar3 = 0;
  iVar2 = 0;
  uVar5 = 0;
  uVar6 = 0;
  do {
    uVar7 = 1 << ((byte)lVar3 & 0x1f);
    if (((uint)includeMask >> ((uint)lVar3 & 0x1f) & 1) == 0) {
      if ((other->skeleton).type[lVar3] != 0) {
LAB_002e9420:
        iVar2 = iVar2 + 0x10000;
        uVar6 = uVar6 | uVar7;
        distanceInfo->extraFieldMask = uVar6;
      }
    }
    else {
      iVar8 = (this->skeleton).type[lVar3];
      iVar1 = (other->skeleton).type[lVar3];
      iVar4 = iVar8 - iVar1;
      if (iVar4 != 0) {
        if (iVar8 == 0) goto LAB_002e9420;
        if (iVar1 == 0) {
          iVar2 = iVar2 + 0x1000;
          uVar5 = uVar5 | uVar7;
          distanceInfo->missingFieldMask = uVar5;
        }
        else {
          iVar8 = -iVar4;
          if (0 < iVar4) {
            iVar8 = iVar4;
          }
          iVar2 = iVar2 + iVar8;
        }
      }
    }
    lVar3 = lVar3 + 1;
    if (lVar3 == 0x10) {
      return iVar2;
    }
  } while( true );
}

Assistant:

int32_t
DateTimeMatcher::getDistance(const DateTimeMatcher& other, int32_t includeMask, DistanceInfo& distanceInfo) const {
    int32_t result = 0;
    distanceInfo.clear();
    for (int32_t i=0; i<UDATPG_FIELD_COUNT; ++i ) {
        int32_t myType = (includeMask&(1<<i))==0 ? 0 : skeleton.type[i];
        int32_t otherType = other.skeleton.type[i];
        if (myType==otherType) {
            continue;
        }
        if (myType==0) {// and other is not
            result += EXTRA_FIELD;
            distanceInfo.addExtra(i);
        }
        else {
            if (otherType==0) {
                result += MISSING_FIELD;
                distanceInfo.addMissing(i);
            }
            else {
                result += abs(myType - otherType);
            }
        }

    }
    return result;
}